

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableDatum.cpp
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::VariableDatum::Decode(VariableDatum *this,KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  KDataStream *this_01;
  double dVar2;
  char local_61;
  ushort local_60;
  KOCTET o;
  KUINT16 j;
  DatumEntry de;
  KUINT16 i;
  KUINT32 ui32LengthInOctets;
  allocator<char> local_39;
  KString local_38;
  KDataStream *local_18;
  KDataStream *stream_local;
  VariableDatum *this_local;
  
  local_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  if (KVar1 < 8) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Decode",&local_39);
    KException::KException(this_00,&local_38,2);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  std::
  vector<KDIS::DATA_TYPE::VariableDatum::DatumEntry,_std::allocator<KDIS::DATA_TYPE::VariableDatum::DatumEntry>_>
  ::clear(&this->m_v8DatumValue);
  this_01 = KDataStream::operator>>(local_18,&this->m_ui32DatumID);
  KDataStream::operator>>(this_01,&this->m_ui32DatumLength);
  dVar2 = ceil((double)this->m_ui32DatumLength * 0.125);
  dVar2 = ceil(dVar2 * 0.125);
  de.Buffer._2_4_ = SUB84((long)(dVar2 * 8.0),0);
  de.Buffer[0] = '\0';
  de.Buffer[1] = '\0';
  while ((uint)(ushort)de.Buffer._0_2_ < (uint)de.Buffer._2_4_) {
    DatumEntry::DatumEntry((DatumEntry *)&stack0xffffffffffffffa2);
    local_60 = 0;
    for (; (uint)(ushort)de.Buffer._0_2_ < (uint)de.Buffer._2_4_ && local_60 < 8;
        de.Buffer._0_2_ = de.Buffer._0_2_ + 1) {
      KDataStream::operator>>(local_18,&local_61);
      (&stack0xffffffffffffffa2)[local_60] = local_61;
      local_60 = local_60 + 1;
    }
    std::
    vector<KDIS::DATA_TYPE::VariableDatum::DatumEntry,_std::allocator<KDIS::DATA_TYPE::VariableDatum::DatumEntry>_>
    ::push_back(&this->m_v8DatumValue,(value_type *)&stack0xffffffffffffffa2);
  }
  return;
}

Assistant:

void VariableDatum::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < VARIABLE_DATUM_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_v8DatumValue.clear();

    stream >> m_ui32DatumID
           >> m_ui32DatumLength;

    KUINT32 ui32LengthInOctets = ceil(ceil(m_ui32DatumLength / 8.0) / 8.0) * 8;

    // Datum length is returned in bits, so we need to convert to octets
    for( KUINT16 i = 0; i < ui32LengthInOctets; )
    {
        DatumEntry de;

        for( KUINT16 j = 0; i < ui32LengthInOctets && j < 8; ++j, ++i )
        {
            KOCTET o;
            stream >> o;
            de.Buffer[j] = o;
        }
        m_v8DatumValue.push_back( de );
    }
}